

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void * tlb_vaddr_to_host_x86_64
                 (CPUArchState *env,abi_ptr addr,MMUAccessType access_type,int mmu_idx)

{
  _Bool _Var1;
  char cVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong index;
  size_t mmu_idx_00;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  CPUX86State *__mptr;
  
  if (MMU_INST_FETCH < access_type) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
               ,0x4f9,(char *)0x0);
  }
  mmu_idx_00 = (size_t)mmu_idx;
  index = env->regs[mmu_idx_00 * 2 + -8] >> 6 & addr >> 0xc;
  lVar7 = index * 0x40 + env->regs[mmu_idx_00 * 2 + -7];
  uVar6 = (ulong)access_type;
  uVar4 = *(ulong *)(lVar7 + uVar6 * 8);
  if ((uVar4 & 0xfffffffffffff800) != (addr & 0xfffffffffffff000)) {
    _Var1 = victim_tlb_hit(env,mmu_idx_00,index,uVar6 * 8,addr & 0xfffffffffffff000);
    if (_Var1) {
      puVar3 = (ulong *)(uVar6 * 8 + lVar7);
    }
    else {
      cVar2 = (**(code **)(*(long *)&env[-1].sysenter_cs + 0x48))
                        (env[-6].mtrr_var + 4,addr,0,access_type,mmu_idx,1,0);
      if (cVar2 == '\0') {
        return (void *)0x0;
      }
      lVar7 = (env->regs[mmu_idx_00 * 2 + -8] >> 6 & addr >> 0xc) * 0x40 +
              env->regs[mmu_idx_00 * 2 + -7];
      puVar3 = (ulong *)(uVar6 * 8 + lVar7);
    }
    uVar4 = *puVar3;
  }
  if ((uVar4 & 0xfff) == 0) {
    pvVar5 = (void *)(addr + *(long *)(lVar7 + 0x20));
  }
  else {
    pvVar5 = (void *)0x0;
  }
  return pvVar5;
}

Assistant:

void *tlb_vaddr_to_host(CPUArchState *env, abi_ptr addr,
                        MMUAccessType access_type, int mmu_idx)
{
    struct uc_struct *uc = env->uc;
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr, page;
    size_t elt_ofs = 0;

    switch (access_type) {
    case MMU_DATA_LOAD:
        elt_ofs = offsetof(CPUTLBEntry, addr_read);
        break;
    case MMU_DATA_STORE:
        elt_ofs = offsetof(CPUTLBEntry, addr_write);
        break;
    case MMU_INST_FETCH:
        elt_ofs = offsetof(CPUTLBEntry, addr_code);
        break;
    default:
        g_assert_not_reached();
    }

    page = addr & TARGET_PAGE_MASK;
    tlb_addr = tlb_read_ofs(entry, elt_ofs);

    if (!tlb_hit_page(uc, tlb_addr, page)) {
        uintptr_t index = tlb_index(env, mmu_idx, addr);

        if (!victim_tlb_hit(env, mmu_idx, index, elt_ofs, page)) {
            CPUState *cs = env_cpu(env);
            CPUClass *cc = CPU_GET_CLASS(cs);

            if (!cc->tlb_fill(cs, addr, 0, access_type, mmu_idx, true, 0)) {
                /* Non-faulting page table read failed.  */
                return NULL;
            }

            /* TLB resize via tlb_fill may have moved the entry.  */
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_read_ofs(entry, elt_ofs);
    }

    if (tlb_addr & ~TARGET_PAGE_MASK) {
        /* IO access */
        return NULL;
    }

    return (void *)((uintptr_t)addr + entry->addend);
}